

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_exception.cpp
# Opt level: O3

wstring * __thiscall
PDA::Exception::SourceException::what_abi_cxx11_
          (wstring *__return_storage_ptr__,SourceException *this)

{
  wstring *pwVar1;
  ulong uVar2;
  undefined8 uVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_c0;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_80;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            (&local_80,vswprintf,0x10,L"%d",(ulong)(uint)this->m_line);
  pwVar1 = (wstring *)
           std::__cxx11::wstring::_M_replace_aux
                     ((ulong)&local_80,local_80._M_string_length,0,L'\x01');
  std::__cxx11::wstring::wstring((wstring *)&local_a0,pwVar1);
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            (&local_c0,vswprintf,0x10,L"%d",(ulong)(uint)this->m_position);
  uVar2 = 3;
  if (local_a0 != local_90) {
    uVar2 = local_90[0];
  }
  if (uVar2 < local_c0._M_string_length + local_98) {
    uVar3 = 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      uVar3 = local_c0.field_2._M_allocated_capacity;
    }
    if (local_c0._M_string_length + local_98 <= (ulong)uVar3) {
      pwVar1 = (wstring *)
               std::__cxx11::wstring::replace((ulong)&local_c0,0,(wchar_t *)0x0,(ulong)local_a0);
      goto LAB_00105589;
    }
  }
  pwVar1 = (wstring *)
           std::__cxx11::wstring::_M_append((wchar_t *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
LAB_00105589:
  std::__cxx11::wstring::wstring((wstring *)&local_60,pwVar1);
  pwVar1 = (wstring *)std::__cxx11::wstring::_M_replace_aux((ulong)&local_60,local_58,0,L'\x01');
  std::__cxx11::wstring::wstring((wstring *)local_40,pwVar1);
  pwVar1 = (wstring *)
           std::__cxx11::wstring::_M_append
                     ((wchar_t *)local_40,
                      (ulong)(this->super_Exception).m_information._M_dataplus._M_p);
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,pwVar1);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] * 4 + 4);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring SourceException::what() const
{
    return std::to_wstring(m_line) + L':' + std::to_wstring(m_position) + L':' + m_information;
}